

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall glslang::TVarSetTraverser::~TVarSetTraverser(TVarSetTraverser *this)

{
  void *in_RSI;
  TVarSetTraverser *this_local;
  
  ~TVarSetTraverser(this);
  TIntermTraverser::operator_delete((TIntermTraverser *)this,in_RSI);
  return;
}

Assistant:

TVarSetTraverser(const TIntermediate& i, const TVarLiveMap& inList, const TVarLiveMap& outList, const TVarLiveMap& uniformList)
      : TLiveTraverser(i, true, true, true, false)
      , inputList(inList)
      , outputList(outList)
      , uniformList(uniformList)
    {
    }